

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_usingCDict_internal
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  U32 UVar1;
  size_t sVar2;
  uint local_178;
  uint local_174;
  unsigned_long_long local_170;
  U32 limitedSrcLog;
  U32 limitedSrcSize;
  undefined1 local_150 [28];
  undefined1 local_134 [20];
  undefined1 local_120 [8];
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  ZSTD_frameParameters fParams_local;
  
  params.fParams.contentSizeFlag = fParams.noDictIDFlag;
  params.cParams._20_8_ = fParams._0_8_;
  if (cdict == (ZSTD_CDict *)0x0) {
    fParams_local.checksumFlag = -0x20;
    fParams_local.noDictIDFlag = -1;
  }
  else {
    if ((((pledgedSrcSize < 0x20000) || (pledgedSrcSize < cdict->dictContentSize * 6)) ||
        (pledgedSrcSize == 0xffffffffffffffff)) || (cdict->compressionLevel == 0)) {
      ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)(local_150 + 0x14),cdict);
      local_120 = (undefined1  [8])local_150._20_8_;
      params.cParams.windowLog = local_134._0_4_;
      params.cParams.chainLog = local_134._4_4_;
      params.cParams.hashLog = local_134._8_4_;
      params.cParams.searchLog = local_134._12_4_;
      params.cParams.minMatch = local_134._16_4_;
    }
    else {
      ZSTD_getCParams((ZSTD_compressionParameters *)&limitedSrcLog,cdict->compressionLevel,
                      pledgedSrcSize,cdict->dictContentSize);
      local_120._0_4_ = limitedSrcLog;
      local_120._4_4_ = limitedSrcSize;
      params.cParams.windowLog = local_150._0_4_;
      params.cParams.chainLog = local_150._4_4_;
      params.cParams.hashLog = local_150._8_4_;
      params.cParams.searchLog = local_150._12_4_;
      params.cParams.minMatch = local_150._16_4_;
    }
    ZSTD_CCtxParams_init_internal
              ((ZSTD_CCtx_params *)&params.fParams.checksumFlag,(ZSTD_parameters *)local_120,
               cdict->compressionLevel);
    if (pledgedSrcSize != 0xffffffffffffffff) {
      local_170 = pledgedSrcSize;
      if (0x7ffff < pledgedSrcSize) {
        local_170 = 0x80000;
      }
      if ((uint)local_170 < 2) {
        local_174 = 1;
      }
      else {
        UVar1 = ZSTD_highbit32((uint)local_170 - 1);
        local_174 = UVar1 + 1;
      }
      if (local_174 < (uint)params.fParams.noDictIDFlag) {
        local_178 = params.fParams.noDictIDFlag;
      }
      else {
        local_178 = local_174;
      }
      params.fParams.noDictIDFlag = local_178;
    }
    fParams_local._4_8_ =
         ZSTD_compressBegin_internal
                   (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,
                    (ZSTD_CCtx_params *)&params.fParams.checksumFlag,pledgedSrcSize,
                    ZSTDb_not_buffered);
  }
  sVar2._0_4_ = fParams_local.checksumFlag;
  sVar2._4_4_ = fParams_local.noDictIDFlag;
  return sVar2;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}